

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::_q_emitCurrentIndexChanged(Picker *this,QModelIndex *index)

{
  int _t1;
  PickerPrivate *this_00;
  QAccessibleEvent local_60 [8];
  QAccessibleEvent event;
  undefined1 local_30 [8];
  QString text;
  QModelIndex *index_local;
  Picker *this_local;
  
  text.d.size = (qsizetype)index;
  _t1 = QModelIndex::row(index);
  currentIndexChanged(this,_t1);
  this_00 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
            ::operator->(&this->d);
  PickerPrivate::itemText((QString *)local_30,this_00,(QModelIndex *)text.d.size);
  currentIndexChanged(this,(QString *)local_30);
  currentTextChanged(this,(QString *)local_30);
  QAccessibleEvent::QAccessibleEvent(local_60,(QObject *)this,NameChanged);
  QAccessible::updateAccessibility((QAccessibleEvent *)local_60);
  QAccessibleEvent::~QAccessibleEvent(local_60);
  QString::~QString((QString *)local_30);
  return;
}

Assistant:

void
Picker::_q_emitCurrentIndexChanged( const QModelIndex & index )
{
	emit currentIndexChanged( index.row() );

	const QString text = d->itemText( index );

	emit currentIndexChanged( text );

	emit currentTextChanged( text );

#ifndef QT_NO_ACCESSIBILITY
	QAccessibleEvent event( this, QAccessible::NameChanged );
	QAccessible::updateAccessibility( &event );
#endif
}